

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::ShaderVkImpl::ShaderVkImpl
          (ShaderVkImpl *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pRenderDeviceVk,
          ShaderCreateInfo *ShaderCI,CreateInfo *VkShaderCI,bool IsDeviceInternal)

{
  IThreadPool *pIVar1;
  IMemoryAllocator *RawAllocator;
  AsyncInitializer *this_00;
  IReferenceCounters *pRefCounters_00;
  TaskImpl *this_01;
  long lVar2;
  RenderDeviceInfo *pRVar3;
  RenderDeviceInfo *pRVar4;
  pointer __p;
  byte bVar5;
  RefCntAutoPtr<TaskImpl> local_940;
  string msg;
  __uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
  local_918;
  anon_class_1136_8_00c597a2_for_Handler local_910;
  anon_class_1136_8_00c597a2_for_Handler local_4a0;
  
  bVar5 = 0;
  ShaderBase<Diligent::EngineVkImplTraits>::ShaderBase
            (&this->super_ShaderBase<Diligent::EngineVkImplTraits>,pRefCounters,pRenderDeviceVk,
             &ShaderCI->Desc,VkShaderCI->DeviceInfo,VkShaderCI->AdapterInfo,IsDeviceInternal);
  (this->super_ShaderBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>.
  super_ObjectBase<Diligent::IShaderVk>.super_RefCountedObject<Diligent::IShaderVk>.super_IShaderVk.
  super_IShader.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_00896fc0;
  (this->m_pShaderResources).
  super___shared_ptr<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_pShaderResources).
  super___shared_ptr<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_EntryPoint)._M_dataplus._M_p = (pointer)&(this->m_EntryPoint).field_2;
  (this->m_EntryPoint)._M_string_length = 0;
  (this->m_EntryPoint).field_2._M_local_buf[0] = '\0';
  (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LOCK();
  (this->super_ShaderBase<Diligent::EngineVkImplTraits>).m_Status._M_i = SHADER_STATUS_COMPILING;
  UNLOCK();
  pIVar1 = VkShaderCI->pCompilationThreadPool;
  if (((pIVar1 == (IThreadPool *)0x0) ||
      ((ShaderCI->CompileFlags & SHADER_COMPILE_FLAG_ASYNCHRONOUS) == SHADER_COMPILE_FLAG_NONE)) ||
     (ShaderCI->ByteCode != (void *)0x0)) {
    Initialize(this,ShaderCI,VkShaderCI);
  }
  else {
    local_910.this = this;
    RawAllocator = GetRawAllocator();
    ShaderCreateInfoWrapper::ShaderCreateInfoWrapper(&local_910.ShaderCI,ShaderCI,RawAllocator);
    local_910.pDXCompiler = VkShaderCI->pDXCompiler;
    pRVar3 = VkShaderCI->DeviceInfo;
    pRVar4 = &local_910.DeviceInfo;
    for (lVar2 = 0x1a; lVar2 != 0; lVar2 = lVar2 + -1) {
      pRVar4->Type = pRVar3->Type;
      pRVar3 = (RenderDeviceInfo *)((long)pRVar3 + (ulong)bVar5 * -8 + 4);
      pRVar4 = (RenderDeviceInfo *)((long)pRVar4 + ((ulong)bVar5 * -2 + 1) * 4);
    }
    memcpy(&local_910.AdapterInfo,VkShaderCI->AdapterInfo,0x334);
    local_910.VkVersion = VkShaderCI->VkVersion;
    local_910.HasSpirv14 = VkShaderCI->HasSpirv14;
    local_910.ppCompilerOutput = VkShaderCI->ppCompilerOutput;
    this_00 = (AsyncInitializer *)::operator_new(0x18);
    ShaderVkImpl(Diligent::IReferenceCounters*,Diligent::RenderDeviceVkImpl*,Diligent::ShaderCreateInfo_const&,Diligent::ShaderVkImpl::CreateInfo_const&,bool)
    ::$_0::__0((__0 *)&local_4a0,&local_910);
    pRefCounters_00 = (IReferenceCounters *)::operator_new(0x30);
    pRefCounters_00->_vptr_IReferenceCounters = (_func_int **)&PTR_AddStrongRef_00891840;
    *(undefined4 *)((long)&pRefCounters_00[5]._vptr_IReferenceCounters + 4) = 0;
    pRefCounters_00[1]._vptr_IReferenceCounters = (_func_int **)0x0;
    pRefCounters_00[2]._vptr_IReferenceCounters = (_func_int **)0x0;
    pRefCounters_00[3]._vptr_IReferenceCounters = (_func_int **)0x0;
    pRefCounters_00[4]._vptr_IReferenceCounters = (_func_int **)0x0;
    *(undefined1 *)&pRefCounters_00[5]._vptr_IReferenceCounters = 0;
    this_01 = (TaskImpl *)malloc(0x490);
    AsyncTaskBase::AsyncTaskBase((AsyncTaskBase *)this_01,pRefCounters_00,0.0);
    (this_01->super_AsyncTaskBase).super_ObjectBase<Diligent::IAsyncTask>.
    super_RefCountedObject<Diligent::IAsyncTask>.super_IAsyncTask.super_IObject._vptr_IObject =
         (_func_int **)&PTR_QueryInterface_00897068;
    ShaderVkImpl(Diligent::IReferenceCounters*,Diligent::RenderDeviceVkImpl*,Diligent::ShaderCreateInfo_const&,Diligent::ShaderVkImpl::CreateInfo_const&,bool)
    ::$_0::__0((__0 *)&this_01->m_Handler,&local_4a0);
    if (*(int *)((long)&pRefCounters_00[5]._vptr_IReferenceCounters + 4) != 0) {
      FormatString<char[33]>(&msg,(char (*) [33])"Object has already been attached");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Attach",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x10d);
      std::__cxx11::string::~string((string *)&msg);
    }
    pRefCounters_00[1]._vptr_IReferenceCounters = (_func_int **)&PTR_DestroyObject_00897108;
    pRefCounters_00[2]._vptr_IReferenceCounters = (_func_int **)this_01;
    pRefCounters_00[3]._vptr_IReferenceCounters = (_func_int **)0x0;
    LOCK();
    *(undefined4 *)((long)&pRefCounters_00[5]._vptr_IReferenceCounters + 4) = 1;
    UNLOCK();
    local_940.m_pObject = this_01;
    RefCountedObject<Diligent::IAsyncTask>::AddRef
              ((RefCountedObject<Diligent::IAsyncTask> *)this_01);
    (*(pIVar1->super_IObject)._vptr_IObject[4])(pIVar1,this_01,0,0);
    local_940.m_pObject = (TaskImpl *)0x0;
    msg._M_dataplus._M_p = (pointer)this_01;
    RefCntAutoPtr<TaskImpl>::~RefCntAutoPtr(&local_940);
    AsyncInitializer::AsyncInitializer(this_00,(RefCntAutoPtr<Diligent::IAsyncTask> *)&msg);
    RefCntAutoPtr<Diligent::IAsyncTask>::Release((RefCntAutoPtr<Diligent::IAsyncTask> *)&msg);
    ShaderCreateInfoWrapper::~ShaderCreateInfoWrapper(&local_4a0.ShaderCI);
    local_918._M_t.
    super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
    .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl =
         (tuple<Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>)
         (_Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
          )0x0;
    std::
    __uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    reset((__uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
           *)&(this->super_ShaderBase<Diligent::EngineVkImplTraits>).m_AsyncInitializer,this_00);
    std::unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    ~unique_ptr((unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
                 *)&local_918);
    ShaderCreateInfoWrapper::~ShaderCreateInfoWrapper(&local_910.ShaderCI);
  }
  return;
}

Assistant:

ShaderVkImpl::ShaderVkImpl(IReferenceCounters*     pRefCounters,
                           RenderDeviceVkImpl*     pRenderDeviceVk,
                           const ShaderCreateInfo& ShaderCI,
                           const CreateInfo&       VkShaderCI,
                           bool                    IsDeviceInternal) :
    // clang-format off
    TShaderBase
    {
        pRefCounters,
        pRenderDeviceVk,
        ShaderCI.Desc,
        VkShaderCI.DeviceInfo,
        VkShaderCI.AdapterInfo,
        IsDeviceInternal
    }
// clang-format on
{
    m_Status.store(SHADER_STATUS_COMPILING);
    if (VkShaderCI.pCompilationThreadPool == nullptr || (ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_ASYNCHRONOUS) == 0 || ShaderCI.ByteCode != nullptr)
    {
        Initialize(ShaderCI, VkShaderCI);
    }
    else
    {
        this->m_AsyncInitializer = AsyncInitializer::Start(
            VkShaderCI.pCompilationThreadPool,
            [this,
             ShaderCI         = ShaderCreateInfoWrapper{ShaderCI, GetRawAllocator()},
             pDXCompiler      = VkShaderCI.pDXCompiler,
             DeviceInfo       = VkShaderCI.DeviceInfo,
             AdapterInfo      = VkShaderCI.AdapterInfo,
             VkVersion        = VkShaderCI.VkVersion,
             HasSpirv14       = VkShaderCI.HasSpirv14,
             ppCompilerOutput = VkShaderCI.ppCompilerOutput](Uint32 ThreadId) mutable //
            {
                try
                {
                    const CreateInfo VkShaderCI{
                        pDXCompiler,
                        DeviceInfo,
                        AdapterInfo,
                        VkVersion,
                        HasSpirv14,
                        ppCompilerOutput,
                        nullptr,
                    };
                    Initialize(ShaderCI, VkShaderCI);
                }
                catch (...)
                {
                    m_Status.store(SHADER_STATUS_FAILED);
                }
                ShaderCI = ShaderCreateInfoWrapper{};
            });
    }
}